

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall
SQVM::CLASS_OP(SQVM *this,SQObjectPtr *target,SQInteger baseclass,SQInteger attributes)

{
  SQObjectPtr *obj1;
  SQObjectPtr *pSVar1;
  bool bVar2;
  SQClass *pSVar3;
  SQChar *pSVar4;
  SQObjectPtr attrs;
  SQObjectPtr ret;
  
  attrs.super_SQObject._type = OT_NULL;
  attrs.super_SQObject._unVal.pTable = (SQTable *)0x0;
  if (baseclass == -1) {
    pSVar3 = (SQClass *)0x0;
  }
  else {
    pSVar1 = (this->_stack)._vals;
    obj1 = pSVar1 + this->_stackbase + baseclass;
    if (pSVar1[this->_stackbase + baseclass].super_SQObject._type != OT_CLASS) {
      pSVar4 = GetTypeName(obj1);
      bVar2 = false;
      Raise_Error(this,"trying to inherit from a %s",pSVar4);
      goto LAB_0012a62c;
    }
    pSVar3 = (obj1->super_SQObject)._unVal.pClass;
  }
  if (attributes != 0xff) {
    SQObjectPtr::operator=(&attrs,(this->_stack)._vals + this->_stackbase + attributes);
  }
  pSVar3 = SQClass::Create(this->_sharedstate,pSVar3);
  SQObjectPtr::operator=(target,pSVar3);
  pSVar3 = (target->super_SQObject)._unVal.pClass;
  if (pSVar3->_metamethods[0x11].super_SQObject._type != OT_NULL) {
    ret.super_SQObject._type = OT_NULL;
    ret.super_SQObject._unVal.pTable = (SQTable *)0x0;
    Push(this,target);
    Push(this,&attrs);
    bVar2 = Call(this,((target->super_SQObject)._unVal.pClass)->_metamethods + 0x11,2,
                 this->_top + -2,&ret,0);
    Pop(this,2);
    SQObjectPtr::~SQObjectPtr(&ret);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_0012a62c;
    }
    pSVar3 = (target->super_SQObject)._unVal.pClass;
  }
  bVar2 = true;
  SQObjectPtr::operator=(&pSVar3->_attributes,&attrs);
LAB_0012a62c:
  SQObjectPtr::~SQObjectPtr(&attrs);
  return bVar2;
}

Assistant:

bool SQVM::CLASS_OP(SQObjectPtr &target,SQInteger baseclass,SQInteger attributes)
{
    SQClass *base = NULL;
    SQObjectPtr attrs;
    if(baseclass != -1) {
        if(type(_stack._vals[_stackbase+baseclass]) != OT_CLASS) { Raise_Error(_SC("trying to inherit from a %s"),GetTypeName(_stack._vals[_stackbase+baseclass])); return false; }
        base = _class(_stack._vals[_stackbase + baseclass]);
    }
    if(attributes != MAX_FUNC_STACKSIZE) {
        attrs = _stack._vals[_stackbase+attributes];
    }
    target = SQClass::Create(_ss(this),base);
    if(type(_class(target)->_metamethods[MT_INHERITED]) != OT_NULL) {
        int nparams = 2;
        SQObjectPtr ret;
        Push(target); Push(attrs);
        if(!Call(_class(target)->_metamethods[MT_INHERITED],nparams,_top - nparams, ret, false)) {
            Pop(nparams);
            return false;
        }
        Pop(nparams);
    }
    _class(target)->_attributes = attrs;
    return true;
}